

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimes.cxx
# Opt level: O0

Status cmFileTimes::Copy(string *fromFile,string *toFile)

{
  bool bVar1;
  Status local_30;
  Status load_status;
  cmFileTimes fileTimes;
  string *toFile_local;
  string *fromFile_local;
  
  cmFileTimes((cmFileTimes *)&load_status);
  local_30 = Load((cmFileTimes *)&load_status,fromFile);
  bVar1 = cmsys::Status::operator_cast_to_bool(&local_30);
  if (bVar1) {
    fromFile_local = (string *)Store((cmFileTimes *)&load_status,toFile);
  }
  else {
    fromFile_local = (string *)local_30;
  }
  ~cmFileTimes((cmFileTimes *)&load_status);
  return (Status)fromFile_local;
}

Assistant:

cmsys::Status cmFileTimes::Copy(std::string const& fromFile,
                                std::string const& toFile)
{
  cmFileTimes fileTimes;
  cmsys::Status load_status = fileTimes.Load(fromFile);
  if (!load_status) {
    return load_status;
  }
  return fileTimes.Store(toFile);
}